

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall embree::Camera::rotate(Camera *this,float dtheta,float dphi)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float in_XMM1_Da;
  float dphi2;
  float phi;
  Vec3fa view1;
  Vec3fa up1;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  __m128 c_3;
  __m128 r_1;
  __m128 a_3;
  Scalar c_4;
  Scalar s;
  Vector u;
  __m128 c_6;
  __m128 r_2;
  __m128 a_5;
  Scalar c_8;
  Scalar s_1;
  Vector u_1;
  __m128 c_10;
  __m128 r_3;
  __m128 a_8;
  vfloat4 c_9;
  vfloat4 b_4;
  vfloat4 a_7;
  vfloat4 c_5;
  vfloat4 b_2;
  vfloat4 a_4;
  vfloat4 c_11;
  vfloat4 b_5;
  vfloat4 a_9;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_2;
  vfloat4 b_1;
  vfloat4 a_2;
  vfloat4 c_7;
  vfloat4 b_3;
  vfloat4 a_6;
  float local_2c70;
  float local_2c6c;
  undefined8 local_2c38;
  undefined8 uStack_2c30;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  undefined8 local_2bf8;
  ulong uStack_2bf0;
  undefined1 local_2be8 [16];
  undefined1 local_2bd8 [16];
  undefined8 local_2bc8;
  undefined8 uStack_2bc0;
  float local_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  undefined4 local_2b9c;
  undefined4 local_2b98;
  float local_2b94;
  float local_2b90;
  float local_2b8c;
  undefined8 local_2b88;
  ulong uStack_2b80;
  undefined1 local_2b78 [16];
  undefined1 local_2b68 [16];
  undefined8 local_2b58;
  undefined8 uStack_2b50;
  float local_2b48;
  float fStack_2b44;
  float fStack_2b40;
  float fStack_2b3c;
  undefined8 local_2b38;
  undefined8 uStack_2b30;
  undefined8 local_2b28;
  undefined8 uStack_2b20;
  undefined8 local_2b18;
  undefined8 uStack_2b10;
  float local_2b08;
  float local_2b04 [3];
  undefined4 *local_2af8;
  undefined4 *local_2af0;
  float *local_2ae8;
  undefined8 *local_2ad8;
  undefined8 *local_2ad0;
  undefined8 *local_2ac0;
  undefined8 *local_2ab8;
  float *local_2aa0;
  undefined8 *local_2a98;
  float *local_2a90;
  undefined8 *local_2a88;
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  undefined8 *local_2a28;
  undefined8 *local_2a20;
  undefined8 *local_2a18;
  undefined8 *local_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 *local_29f8;
  undefined8 *local_29f0;
  undefined8 *local_29e8;
  undefined8 *local_29e0;
  undefined8 local_29d8;
  undefined8 uStack_29d0;
  undefined8 *local_29c8;
  undefined8 *local_29c0;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  undefined8 local_2998;
  undefined8 uStack_2990;
  undefined1 local_2988 [16];
  undefined8 local_2978;
  undefined8 uStack_2970;
  undefined8 local_2968;
  undefined8 uStack_2960;
  undefined1 local_2958 [16];
  undefined8 local_2948;
  undefined8 uStack_2940;
  float local_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  undefined8 *local_2920;
  undefined8 *local_2918;
  undefined8 *local_2910;
  undefined8 local_2908;
  undefined8 uStack_2900;
  float local_28ec;
  undefined8 *local_28e8;
  undefined8 *local_28e0;
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  float local_28bc;
  undefined8 *local_28b8;
  undefined8 *local_28b0;
  ulong local_28a8;
  undefined8 uStack_28a0;
  undefined1 local_2898 [16];
  ulong local_2888;
  undefined8 uStack_2880;
  float local_286c;
  ulong local_2868;
  undefined8 uStack_2860;
  undefined1 local_2858 [16];
  ulong local_2848;
  undefined8 uStack_2840;
  float local_282c;
  undefined8 *local_2828;
  undefined8 *local_2820;
  undefined8 *local_2818;
  undefined8 *local_2810;
  undefined8 *local_2808;
  undefined8 *local_2800;
  undefined8 *local_27f8;
  undefined8 *local_27f0;
  undefined8 *local_27e8;
  undefined8 *local_27e0;
  undefined8 *local_27d8;
  undefined8 *local_27d0;
  undefined8 *local_27c8;
  undefined8 *local_27c0;
  undefined8 *local_27b8;
  float local_2794;
  undefined8 *local_2790;
  float local_2784;
  undefined8 *local_2780;
  float local_2748;
  float fStack_2744;
  float fStack_2740;
  float fStack_273c;
  float local_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  undefined8 local_2728;
  undefined8 uStack_2720;
  undefined8 local_2718;
  undefined8 uStack_2710;
  undefined8 local_2708;
  undefined8 uStack_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  undefined8 local_26e8;
  undefined8 uStack_26e0;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  float local_2688;
  float fStack_2684;
  float fStack_2680;
  float fStack_267c;
  undefined8 *local_2670;
  float local_2668;
  float fStack_2664;
  float fStack_2660;
  float fStack_265c;
  undefined8 *local_2650;
  float local_2648;
  float fStack_2644;
  float fStack_2640;
  float fStack_263c;
  undefined8 *local_2630;
  float local_2628;
  float fStack_2624;
  float fStack_2620;
  float fStack_261c;
  undefined8 *local_2610;
  float local_2608;
  float fStack_2604;
  float fStack_2600;
  float fStack_25fc;
  undefined8 *local_25f0;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  undefined8 *local_25d0;
  float local_25a8;
  float fStack_25a4;
  float fStack_25a0;
  float fStack_259c;
  undefined8 *local_2590;
  float local_2588;
  float fStack_2584;
  float fStack_2580;
  float fStack_257c;
  undefined8 *local_2570;
  float local_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  float local_252c;
  float local_2528;
  float fStack_2524;
  float fStack_2520;
  float fStack_251c;
  float local_250c;
  undefined1 local_2508 [16];
  undefined4 local_24ec;
  undefined1 local_24e8 [16];
  undefined4 local_24cc;
  undefined1 local_24c8 [16];
  float local_24ac;
  undefined1 local_24a8 [16];
  undefined4 local_248c;
  undefined1 local_2488 [16];
  undefined4 local_246c;
  undefined1 local_2468 [16];
  float local_244c;
  ulong local_2448;
  undefined8 uStack_2440;
  ulong local_2438;
  undefined8 uStack_2430;
  ulong local_2428;
  undefined8 uStack_2420;
  ulong local_2418;
  undefined8 uStack_2410;
  ulong local_2408;
  undefined8 uStack_2400;
  ulong local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  ulong local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  ulong local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  ulong local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  ulong local_2358;
  undefined8 uStack_2350;
  undefined8 local_2348;
  undefined8 uStack_2340;
  ulong local_2338;
  undefined8 uStack_2330;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  undefined8 local_2308;
  undefined8 uStack_2300;
  ulong local_22f8;
  undefined8 uStack_22f0;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  ulong local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  ulong local_22b8;
  undefined8 uStack_22b0;
  ulong local_22a8;
  undefined8 uStack_22a0;
  ulong local_2298;
  undefined8 uStack_2290;
  undefined1 *local_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 *local_2250;
  undefined1 *local_2230;
  float local_2228;
  float fStack_2224;
  float fStack_2220;
  float fStack_221c;
  float *local_2210;
  undefined8 *local_2208;
  undefined8 *local_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 *local_21e0;
  undefined8 *local_21d8;
  undefined8 *local_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 *local_21b0;
  undefined1 *local_21a8;
  undefined8 *local_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 *local_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 *local_2160;
  undefined8 *local_2158;
  float *local_2150;
  undefined8 *local_2148;
  undefined8 *local_2140;
  float *local_2138;
  undefined8 *local_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  float local_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float local_2108;
  float fStack_2104;
  float fStack_2100;
  float fStack_20fc;
  undefined8 *local_20f8;
  undefined1 *local_20f0;
  undefined8 *local_20e8;
  undefined8 *local_20e0;
  float fStack_20d4;
  float fStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  float local_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  undefined8 *local_20a8;
  undefined8 *local_20a0;
  undefined1 local_2098 [16];
  undefined1 local_2088 [16];
  undefined1 local_2078 [16];
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined1 *local_2038;
  undefined8 *local_2030;
  undefined8 *local_2028;
  float *local_2020;
  undefined1 *local_2018;
  undefined8 *local_2010;
  undefined8 *local_2008;
  undefined8 *local_2000;
  undefined8 *local_1ff8;
  undefined8 *local_1ff0;
  float local_1fe8;
  float fStack_1fe4;
  float fStack_1fe0;
  float fStack_1fdc;
  undefined8 *local_1fd0;
  undefined8 *local_1fc8;
  undefined8 *local_1fc0;
  float local_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 *local_1f58;
  undefined8 *local_1f50;
  float *local_1f48;
  undefined8 *local_1f40;
  undefined8 *local_1f38;
  float *local_1f30;
  undefined8 local_1f28;
  ulong uStack_1f20;
  undefined1 local_1f18 [8];
  ulong uStack_1f10;
  undefined1 local_1f08 [8];
  ulong uStack_1f00;
  float *local_1ef0;
  undefined8 *local_1ee8;
  undefined8 *local_1ee0;
  undefined8 local_1ed8;
  ulong uStack_1ed0;
  undefined1 local_1ec8 [8];
  ulong uStack_1ec0;
  undefined1 local_1eb8 [8];
  ulong uStack_1eb0;
  float *local_1ea8;
  undefined8 *local_1ea0;
  undefined8 *local_1e98;
  undefined1 *local_1e90;
  undefined1 *local_1e88;
  undefined8 *local_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 *local_1e60;
  undefined8 *local_1e58;
  undefined8 *local_1e50;
  undefined8 *local_1e48;
  undefined8 *local_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  float local_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  undefined8 *local_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined1 local_1dd8 [16];
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 *local_1da8;
  undefined8 *local_1da0;
  float *local_1d98;
  undefined1 *local_1d90;
  undefined8 *local_1d88;
  undefined8 *local_1d80;
  float local_1d74;
  undefined8 *local_1d70;
  undefined1 *local_1d60;
  undefined1 local_1d54 [12];
  float local_1d48;
  float fStack_1d44;
  float fStack_1d40;
  float fStack_1d3c;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  float local_1d28;
  float fStack_1d24;
  float fStack_1d20;
  float fStack_1d1c;
  undefined8 *local_1d10;
  undefined1 local_1d08 [8];
  undefined1 auStack_1d00 [20];
  double local_1cec;
  float local_1cc8;
  float fStack_1cc4;
  float fStack_1cc0;
  float fStack_1cbc;
  float local_1cac;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 *local_1c58;
  undefined8 *local_1c50;
  float *local_1c48;
  undefined1 *local_1c40;
  undefined8 *local_1c38;
  undefined8 *local_1c30;
  float local_1c24;
  undefined8 *local_1c20;
  float local_1c14;
  undefined8 *local_1c10;
  float local_1c04;
  undefined8 *local_1c00;
  float local_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  undefined8 *local_1bc0;
  float local_1bb8;
  float fStack_1bb4;
  float fStack_1bb0;
  float fStack_1bac;
  float local_1b9c;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float local_1b7c;
  float local_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float local_1b5c;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  undefined8 *local_1b38;
  float *local_1b30;
  undefined8 *local_1b28;
  undefined8 *local_1b20;
  float *local_1b18;
  undefined8 *local_1b10;
  undefined8 *local_1b08;
  undefined8 *local_1b00;
  float local_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  float local_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  undefined8 *local_1ac0;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float *local_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 *local_1a88;
  undefined1 *local_1a80;
  undefined8 *local_1a78;
  undefined8 *local_1a70;
  undefined8 *local_1a68;
  undefined8 *local_1a60;
  undefined8 *local_1a58;
  undefined1 *local_1a50;
  undefined8 *local_1a48;
  undefined8 *local_1a40;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  undefined8 *local_1a00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  undefined8 *local_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 *local_19c8;
  undefined8 *local_19c0;
  undefined8 *local_19b8;
  float *local_19b0;
  undefined8 *local_19a8;
  undefined8 *local_19a0;
  float *local_1998;
  undefined8 *local_1990;
  undefined8 *local_1988;
  undefined8 *local_1980;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  undefined8 local_1968;
  undefined8 uStack_1960;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  undefined8 *local_1940;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float *local_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 *local_1908;
  undefined1 *local_1900;
  undefined1 *local_18f8;
  undefined8 *local_18f0;
  undefined8 *local_18e8;
  undefined8 *local_18e0;
  undefined8 *local_18d8;
  undefined1 *local_18d0;
  undefined1 *local_18c8;
  undefined8 *local_18c0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  undefined8 *local_1880;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  undefined8 *local_1860;
  float local_1854;
  float local_1850;
  float local_184c;
  float local_1848;
  float local_1844;
  float local_1840;
  float local_183c;
  float local_1838;
  float local_1834;
  float local_1830;
  float local_182c;
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float *local_1810;
  undefined8 *local_1808;
  undefined8 *local_1800;
  undefined8 *local_17f8;
  float *local_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 *local_17d8;
  undefined8 *local_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  float local_17ac;
  undefined8 *local_17a8;
  float *local_17a0;
  ulong local_1798;
  undefined8 uStack_1790;
  undefined1 local_1788 [16];
  ulong local_1778;
  undefined8 uStack_1770;
  float local_175c;
  undefined8 *local_1758;
  undefined8 *local_1750;
  float *local_1748;
  undefined8 *local_1740;
  undefined8 *local_1738;
  undefined8 *local_1730;
  float local_1724;
  undefined8 *local_1720;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  float local_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  undefined8 *local_16c0;
  float local_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float *local_16a0;
  float local_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float local_167c;
  undefined1 local_1678 [16];
  undefined4 local_165c;
  undefined1 local_1658 [16];
  undefined4 local_163c;
  undefined1 local_1638 [16];
  float local_161c;
  ulong local_1618;
  undefined8 uStack_1610;
  ulong local_1608;
  undefined8 uStack_1600;
  ulong local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  ulong local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  ulong local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  ulong local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  ulong local_1558;
  undefined8 uStack_1550;
  ulong local_1548;
  undefined8 uStack_1540;
  float local_1534;
  float local_1530;
  float local_152c;
  float local_1528;
  float local_1524;
  float local_1520;
  float local_151c;
  float local_1518;
  float local_1514;
  float local_1510;
  float local_150c;
  float local_1508;
  float fStack_1504;
  float fStack_1500;
  float *local_14f0;
  undefined8 *local_14e8;
  undefined8 *local_14e0;
  undefined8 *local_14d8;
  float *local_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 *local_14b8;
  undefined8 *local_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  float local_148c;
  undefined8 *local_1488;
  float *local_1480;
  ulong local_1478;
  undefined8 uStack_1470;
  undefined1 local_1468 [16];
  ulong local_1458;
  undefined8 uStack_1450;
  float local_143c;
  undefined8 *local_1438;
  undefined8 *local_1430;
  float *local_1428;
  undefined8 *local_1420;
  undefined8 *local_1418;
  undefined8 *local_1410;
  float local_1404;
  undefined8 *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  undefined8 *local_13a0;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float *local_1380;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_135c;
  undefined1 local_1358 [16];
  undefined4 local_133c;
  undefined1 local_1338 [16];
  undefined4 local_131c;
  undefined1 local_1318 [16];
  float local_12fc;
  ulong local_12f8;
  undefined8 uStack_12f0;
  ulong local_12e8;
  undefined8 uStack_12e0;
  ulong local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  ulong local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  ulong local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  ulong local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  ulong local_1238;
  undefined8 uStack_1230;
  ulong local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 *local_1200;
  undefined8 *local_11f8;
  undefined8 *local_11f0;
  undefined8 *local_11e8;
  undefined8 *local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  float local_119c;
  float local_1198;
  float local_1194;
  float *local_1190;
  float *local_1188;
  float *local_1180;
  float *local_1178;
  float *local_1170;
  float *local_1168;
  float *local_1160;
  float *local_1158;
  float *local_1150;
  undefined8 *local_1148;
  float local_113c;
  float local_1138;
  float local_1134;
  undefined8 *local_1130;
  undefined1 *local_1118;
  undefined1 *local_1100;
  ulong uStack_10f0;
  undefined4 local_10dc;
  ulong uStack_10d0;
  undefined4 local_10bc;
  undefined8 local_10b8;
  ulong uStack_10b0;
  float local_10a0;
  float local_109c;
  float local_1098;
  undefined4 local_1094;
  float *local_1090;
  float *local_1088;
  float *local_1080;
  float *local_1078;
  float *local_1070;
  float *local_1068;
  float *local_1060;
  float *local_1058;
  float *local_1050;
  undefined8 *local_1048;
  float local_103c;
  float local_1038;
  float local_1034;
  undefined8 *local_1030;
  undefined1 *local_1018;
  undefined1 *local_1000;
  ulong uStack_ff0;
  undefined4 local_fdc;
  ulong uStack_fd0;
  undefined4 local_fbc;
  undefined8 local_fb8;
  ulong uStack_fb0;
  float local_fa8;
  float local_fa4;
  float local_fa0;
  undefined4 local_f9c;
  undefined8 *local_f98;
  undefined8 *local_f90;
  undefined1 *local_f88;
  undefined1 *local_f80;
  undefined8 *local_f78;
  undefined8 *local_f70;
  undefined1 *local_f68;
  undefined1 *local_f60;
  undefined8 *local_f58;
  undefined8 *local_f50;
  undefined1 *local_f48;
  undefined1 *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  undefined8 *local_f28;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined1 *local_f08;
  undefined1 *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  undefined8 *local_ee8;
  undefined8 *local_ee0;
  undefined8 *local_ed8;
  undefined8 *local_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  float local_e9c;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  undefined8 local_e88;
  undefined8 uStack_e80;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  undefined8 local_e68;
  undefined8 uStack_e60;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  undefined8 local_e48;
  undefined8 uStack_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  float fStack_dfc;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 *local_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 *local_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 *local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 *local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined8 *local_a40;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 *local_a08;
  undefined8 *local_a00;
  undefined8 *local_9f8;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  fVar18 = local_2b28._4_4_;
  fVar22 = local_2b90;
  local_2b04[0] = in_XMM0_Da;
  if (*(int *)((long)in_RDI + 0x34) == 1) {
    local_2b04[0] = in_XMM0_Da * -1.0;
  }
  local_29e8 = in_RDI + 4;
  local_27e8 = &local_29d8;
  uVar1 = *local_29e8;
  uVar2 = in_RDI[5];
  uVar3 = *local_29e8;
  uVar4 = in_RDI[5];
  local_26f8._0_4_ = (float)uVar1;
  local_26f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_26f0._0_4_ = (float)uVar2;
  uStack_26f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_2708._0_4_ = (float)uVar3;
  local_2708._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_2700._0_4_ = (float)uVar4;
  uStack_2700._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_2648 = (float)local_26f8 * (float)local_2708;
  fStack_2644 = local_26f8._4_4_ * local_2708._4_4_;
  fStack_2640 = (float)uStack_26f0 * (float)uStack_2700;
  fStack_263c = uStack_26f0._4_4_ * uStack_2700._4_4_;
  local_bd8 = CONCAT44(fStack_2644,local_2648);
  uStack_bd0 = CONCAT44(fStack_263c,fStack_2640);
  local_bc8 = &local_c08;
  local_a68 = &local_c18;
  local_758 = CONCAT44(fStack_2644,fStack_2644);
  uStack_750 = CONCAT44(fStack_2644,fStack_2644);
  local_a08 = &local_c28;
  local_7c8 = CONCAT44(fStack_2640,fStack_2640);
  uStack_7c0 = CONCAT44(fStack_2640,fStack_2640);
  local_808 = &local_c48;
  local_788 = local_2648 + fStack_2644;
  fStack_784 = fStack_2644 + fStack_2644;
  fStack_780 = fStack_2640 + fStack_2644;
  fStack_77c = fStack_263c + fStack_2644;
  local_7b8 = CONCAT44(fStack_784,local_788);
  uStack_7b0 = CONCAT44(fStack_77c,fStack_780);
  local_bc0 = &local_c38;
  local_286c = local_788 + fStack_2640;
  fStack_7f4 = fStack_784 + fStack_2640;
  fStack_7f0 = fStack_780 + fStack_2640;
  fStack_7ec = fStack_77c + fStack_2640;
  local_be8 = CONCAT44(fStack_7f4,local_286c);
  uStack_be0 = CONCAT44(fStack_7ec,fStack_7f0);
  local_2468 = ZEXT416((uint)local_286c);
  local_2888 = CONCAT44(0,local_286c);
  uStack_2880 = 0;
  uStack_2430 = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_2888;
  local_2898 = rsqrtss(auVar12,auVar12);
  local_246c = 0x3fc00000;
  local_2488 = ZEXT416(0x3fc00000);
  local_22c8 = local_2898._0_8_;
  uVar20 = local_22c8;
  uStack_22c0 = local_2898._8_8_;
  local_22c8._0_4_ = local_2898._0_4_;
  local_22b8 = (ulong)(uint)((float)local_22c8 * 1.5);
  uStack_22b0 = 0;
  local_248c = 0xbf000000;
  local_24a8 = ZEXT416(0xbf000000);
  local_22e8 = local_24a8._0_8_;
  uStack_22e0 = 0;
  local_22d8 = (ulong)(uint)(local_286c * -0.5);
  uStack_22d0 = 0;
  local_2308 = local_2898._0_8_;
  uStack_2300 = local_2898._8_8_;
  local_28ec = local_286c * -0.5 * (float)local_22c8;
  local_22f8 = (ulong)(uint)local_28ec;
  uStack_22f0 = 0;
  local_2328 = local_2898._0_8_;
  uStack_2320 = local_2898._8_8_;
  local_2318 = CONCAT44(local_2898._4_4_,(float)local_22c8 * (float)local_22c8);
  uStack_2310 = local_2898._8_8_;
  local_2348 = local_2318;
  uStack_2340 = local_2898._8_8_;
  local_28ec = local_28ec * (float)local_22c8 * (float)local_22c8;
  local_2338 = (ulong)(uint)local_28ec;
  uStack_2330 = 0;
  local_2408 = local_2338;
  uStack_2400 = 0;
  local_28ec = (float)local_22c8 * 1.5 + local_28ec;
  local_23f8 = (ulong)(uint)local_28ec;
  uStack_23f0 = 0;
  local_28a8 = local_23f8;
  uStack_28a0 = 0;
  local_2298 = local_23f8;
  uStack_2290 = 0;
  local_2810 = &local_2908;
  local_26e8 = CONCAT44(local_28ec,local_28ec);
  uStack_26e0 = CONCAT44(local_28ec,local_28ec);
  uVar5 = *local_29e8;
  uVar6 = in_RDI[5];
  local_26d8._0_4_ = (float)uVar5;
  local_26d8._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_26d0._0_4_ = (float)uVar6;
  uStack_26d0._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_2628 = (float)local_26d8 * local_28ec;
  fStack_2624 = local_26d8._4_4_ * local_28ec;
  fStack_2620 = (float)uStack_26d0 * local_28ec;
  fStack_261c = uStack_26d0._4_4_ * local_28ec;
  local_2ac0 = in_RDI + 2;
  local_2ab8 = &local_2b38;
  uVar7 = *local_2ac0;
  uVar8 = in_RDI[3];
  uVar9 = *in_RDI;
  uVar10 = in_RDI[1];
  local_1f88._0_4_ = (float)uVar7;
  local_1f88._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_1f80._0_4_ = (float)uVar8;
  uStack_1f80._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_1f98._0_4_ = (float)uVar9;
  local_1f98._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_1f90._0_4_ = (float)uVar10;
  uStack_1f90._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_25a8 = (float)local_1f88 - (float)local_1f98;
  fStack_25a4 = local_1f88._4_4_ - local_1f98._4_4_;
  fStack_25a0 = (float)uStack_1f80 - (float)uStack_1f90;
  fStack_259c = uStack_1f80._4_4_ - uStack_1f90._4_4_;
  local_2728 = CONCAT44(fStack_25a4,local_25a8);
  uStack_2720 = CONCAT44(fStack_259c,fStack_25a0);
  local_27d0 = &local_2a08;
  local_2668 = local_25a8 * local_25a8;
  fStack_2664 = fStack_25a4 * fStack_25a4;
  fStack_2660 = fStack_25a0 * fStack_25a0;
  fStack_265c = fStack_259c * fStack_259c;
  local_b48 = CONCAT44(fStack_2664,local_2668);
  uStack_b40 = CONCAT44(fStack_265c,fStack_2660);
  local_b38 = &local_b78;
  local_a78 = &local_b88;
  local_838 = CONCAT44(fStack_2664,fStack_2664);
  uStack_830 = CONCAT44(fStack_2664,fStack_2664);
  local_a18 = &local_b98;
  local_8a8 = CONCAT44(fStack_2660,fStack_2660);
  uStack_8a0 = CONCAT44(fStack_2660,fStack_2660);
  local_8e8 = &local_bb8;
  local_868 = local_2668 + fStack_2664;
  fStack_864 = fStack_2664 + fStack_2664;
  fStack_860 = fStack_2660 + fStack_2664;
  fStack_85c = fStack_265c + fStack_2664;
  local_898 = CONCAT44(fStack_864,local_868);
  uStack_890 = CONCAT44(fStack_85c,fStack_860);
  local_b30 = &local_ba8;
  local_282c = local_868 + fStack_2660;
  fStack_8d4 = fStack_864 + fStack_2660;
  fStack_8d0 = fStack_860 + fStack_2660;
  fStack_8cc = fStack_85c + fStack_2660;
  local_b58 = CONCAT44(fStack_8d4,local_282c);
  uStack_b50 = CONCAT44(fStack_8cc,fStack_8d0);
  local_24c8 = ZEXT416((uint)local_282c);
  local_2848 = CONCAT44(0,local_282c);
  uStack_2840 = 0;
  uStack_2440 = 0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_2848;
  local_2858 = rsqrtss(auVar11,auVar11);
  local_24cc = 0x3fc00000;
  local_24e8 = ZEXT416(0x3fc00000);
  local_2368 = local_2858._0_8_;
  uVar19 = local_2368;
  uStack_2360 = local_2858._8_8_;
  local_2368._0_4_ = local_2858._0_4_;
  local_2358 = (ulong)(uint)((float)local_2368 * 1.5);
  uStack_2350 = 0;
  local_24ec = 0xbf000000;
  local_2508 = ZEXT416(0xbf000000);
  local_2388 = local_2508._0_8_;
  uStack_2380 = 0;
  local_2378 = (ulong)(uint)(local_282c * -0.5);
  uStack_2370 = 0;
  local_23a8 = local_2858._0_8_;
  uStack_23a0 = local_2858._8_8_;
  local_28bc = local_282c * -0.5 * (float)local_2368;
  local_2398 = (ulong)(uint)local_28bc;
  uStack_2390 = 0;
  local_23c8 = local_2858._0_8_;
  uStack_23c0 = local_2858._8_8_;
  local_23b8 = CONCAT44(local_2858._4_4_,(float)local_2368 * (float)local_2368);
  uStack_23b0 = local_2858._8_8_;
  local_23e8 = local_23b8;
  uStack_23e0 = local_2858._8_8_;
  local_28bc = local_28bc * (float)local_2368 * (float)local_2368;
  local_23d8 = (ulong)(uint)local_28bc;
  uStack_23d0 = 0;
  local_2428 = local_23d8;
  uStack_2420 = 0;
  local_28bc = (float)local_2368 * 1.5 + local_28bc;
  local_2418 = (ulong)(uint)local_28bc;
  uStack_2410 = 0;
  local_2868 = local_2418;
  uStack_2860 = 0;
  local_22a8 = local_2418;
  uStack_22a0 = 0;
  local_2828 = &local_28d8;
  local_26c8 = CONCAT44(local_28bc,local_28bc);
  uStack_26c0 = CONCAT44(local_28bc,local_28bc);
  local_2608 = local_25a8 * local_28bc;
  fStack_2604 = fStack_25a4 * local_28bc;
  fStack_2600 = fStack_25a0 * local_28bc;
  fStack_25fc = fStack_259c * local_28bc;
  local_2b28 = CONCAT44(fStack_2604,local_2608);
  uStack_2b20 = (double)CONCAT44(fStack_25fc,fStack_2600);
  local_1ea8 = local_2b04;
  local_17f0 = &local_1828;
  local_1730 = &local_17e8;
  local_16d8 = local_2628 * local_2628;
  fStack_16d4 = fStack_2624 * fStack_2624;
  fStack_16d0 = fStack_2620 * fStack_2620;
  fStack_16cc = fStack_261c * fStack_261c;
  local_cf8 = CONCAT44(fStack_16d4,local_16d8);
  uStack_cf0 = CONCAT44(fStack_16cc,fStack_16d0);
  local_ce8 = &local_d28;
  local_a48 = &local_d38;
  local_598 = CONCAT44(fStack_16d4,fStack_16d4);
  uStack_590 = CONCAT44(fStack_16d4,fStack_16d4);
  local_9e8 = &local_d48;
  local_608 = CONCAT44(fStack_16d0,fStack_16d0);
  uStack_600 = CONCAT44(fStack_16d0,fStack_16d0);
  local_648 = &local_d68;
  local_5c8 = local_16d8 + fStack_16d4;
  fStack_5c4 = fStack_16d4 + fStack_16d4;
  fStack_5c0 = fStack_16d0 + fStack_16d4;
  fStack_5bc = fStack_16cc + fStack_16d4;
  local_5f8 = CONCAT44(fStack_5c4,local_5c8);
  uStack_5f0 = CONCAT44(fStack_5bc,fStack_5c0);
  local_ce0 = &local_d58;
  local_175c = local_5c8 + fStack_16d0;
  fStack_634 = fStack_5c4 + fStack_16d0;
  fStack_630 = fStack_5c0 + fStack_16d0;
  fStack_62c = fStack_5bc + fStack_16d0;
  local_d08 = CONCAT44(fStack_634,local_175c);
  uStack_d00 = CONCAT44(fStack_62c,fStack_630);
  local_1638 = ZEXT416((uint)local_175c);
  local_1778 = CONCAT44(0,local_175c);
  uStack_1770 = 0;
  uStack_1610 = 0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_1778;
  local_1788 = rsqrtss(auVar13,auVar13);
  local_163c = 0x3fc00000;
  local_1658 = ZEXT416(0x3fc00000);
  local_1568 = local_1788._0_8_;
  uVar21 = local_1568;
  uStack_1560 = local_1788._8_8_;
  local_1568._0_4_ = local_1788._0_4_;
  local_1558 = (ulong)(uint)((float)local_1568 * 1.5);
  uStack_1550 = 0;
  local_165c = 0xbf000000;
  local_1678 = ZEXT416(0xbf000000);
  local_1588 = local_1678._0_8_;
  uStack_1580 = 0;
  local_1578 = (ulong)(uint)(local_175c * -0.5);
  uStack_1570 = 0;
  local_15a8 = local_1788._0_8_;
  uStack_15a0 = local_1788._8_8_;
  local_17ac = local_175c * -0.5 * (float)local_1568;
  local_1598 = (ulong)(uint)local_17ac;
  uStack_1590 = 0;
  local_15c8 = local_1788._0_8_;
  uStack_15c0 = local_1788._8_8_;
  local_15b8 = CONCAT44(local_1788._4_4_,(float)local_1568 * (float)local_1568);
  uStack_15b0 = local_1788._8_8_;
  local_15e8 = local_15b8;
  uStack_15e0 = local_1788._8_8_;
  local_17ac = local_17ac * (float)local_1568 * (float)local_1568;
  local_15d8 = (ulong)(uint)local_17ac;
  uStack_15d0 = 0;
  local_1608 = local_15d8;
  uStack_1600 = 0;
  local_17ac = (float)local_1568 * 1.5 + local_17ac;
  local_15f8 = (ulong)(uint)local_17ac;
  uStack_15f0 = 0;
  local_1798 = local_15f8;
  uStack_1790 = 0;
  local_1548 = local_15f8;
  uStack_1540 = 0;
  local_1758 = &local_17c8;
  local_16f8 = CONCAT44(local_17ac,local_17ac);
  uStack_16f0 = CONCAT44(local_17ac,local_17ac);
  local_1828 = local_2628 * local_17ac;
  fStack_1824 = fStack_2624 * local_17ac;
  fStack_1820 = fStack_2620 * local_17ac;
  fStack_16ac = fStack_261c * local_17ac;
  local_119c = local_2b04[0];
  local_2b08 = in_XMM1_Da;
  local_2a18 = local_2ab8;
  local_2a10 = &local_2b28;
  local_29f8 = local_2ab8;
  local_29f0 = local_2ab8;
  local_29e0 = &local_2b18;
  local_29c8 = local_29e8;
  local_29c0 = local_29e8;
  local_28e8 = local_29e8;
  local_28e0 = &local_2b18;
  local_28b8 = local_2ab8;
  local_28b0 = &local_2b28;
  local_2820 = local_2ab8;
  local_2818 = &local_2b28;
  local_2808 = local_29e8;
  local_2800 = &local_2b18;
  local_27f8 = local_29e8;
  local_27f0 = local_29e8;
  local_27e0 = local_2ab8;
  local_27d8 = local_2ab8;
  local_2794 = local_28bc;
  local_2790 = local_2828;
  local_2784 = local_28ec;
  local_2780 = local_2810;
  local_2718 = local_2728;
  uStack_2710 = uStack_2720;
  local_2708 = uVar3;
  uStack_2700 = uVar4;
  local_26f8 = uVar1;
  uStack_26f0 = uVar2;
  local_26d8 = uVar5;
  uStack_26d0 = uVar6;
  local_26b8 = local_2728;
  uStack_26b0 = uStack_2720;
  local_2650 = local_27d0;
  local_2630 = local_27e8;
  local_2610 = &local_2b18;
  local_25f0 = &local_2b28;
  local_2590 = local_2ab8;
  local_2548 = local_28ec;
  fStack_2544 = local_28ec;
  fStack_2540 = local_28ec;
  fStack_253c = local_28ec;
  local_252c = local_28ec;
  local_2528 = local_28bc;
  fStack_2524 = local_28bc;
  fStack_2520 = local_28bc;
  fStack_251c = local_28bc;
  local_250c = local_28bc;
  local_24ac = local_282c;
  local_244c = local_286c;
  local_2448 = local_2848;
  local_2438 = local_2888;
  local_2368 = uVar19;
  local_22c8 = uVar20;
  local_1f98 = uVar9;
  uStack_1f90 = uVar10;
  local_1f88 = uVar7;
  uStack_1f80 = uVar8;
  local_1ea0 = &local_2b18;
  local_1e98 = &local_2b88;
  local_1810 = local_1ea8;
  local_1808 = &local_2b18;
  local_1800 = &local_1ed8;
  local_17f8 = &local_2b18;
  local_17d8 = &local_2b18;
  local_17d0 = &local_2b18;
  local_17a8 = &local_2b18;
  local_17a0 = local_17f0;
  local_1750 = &local_2b18;
  local_1748 = local_17f0;
  local_1740 = &local_2b18;
  local_1738 = &local_2b18;
  local_1724 = local_17ac;
  local_1720 = local_1758;
  local_16c0 = local_1730;
  local_16b8 = local_1828;
  fStack_16b4 = fStack_1824;
  fStack_16b0 = fStack_1820;
  local_16a0 = local_17f0;
  local_1698 = local_17ac;
  fStack_1694 = local_17ac;
  fStack_1690 = local_17ac;
  fStack_168c = local_17ac;
  local_167c = local_17ac;
  local_161c = local_175c;
  local_1618 = local_1778;
  local_1568 = uVar21;
  local_d10 = local_1730;
  local_bf0 = local_27e8;
  local_b60 = local_27d0;
  local_a80 = local_b38;
  local_a70 = local_bc8;
  local_a50 = local_ce8;
  local_a20 = local_b38;
  local_a10 = local_bc8;
  local_9f0 = local_ce8;
  local_8f0 = local_a18;
  local_8e0 = local_b30;
  local_8d8 = local_282c;
  local_8c0 = local_b30;
  local_8b8 = local_a18;
  local_8b0 = local_8e8;
  local_880 = local_a78;
  local_878 = local_b38;
  local_870 = local_8e8;
  local_850 = local_8e8;
  local_848 = local_a78;
  local_840 = local_b38;
  local_828 = local_b48;
  uStack_820 = uStack_b40;
  local_810 = local_a08;
  local_800 = local_bc0;
  local_7f8 = local_286c;
  local_7e0 = local_bc0;
  local_7d8 = local_a08;
  local_7d0 = local_808;
  local_7a0 = local_a68;
  local_798 = local_bc8;
  local_790 = local_808;
  local_770 = local_808;
  local_768 = local_a68;
  local_760 = local_bc8;
  local_748 = local_bd8;
  uStack_740 = uStack_bd0;
  local_650 = local_9e8;
  local_640 = local_ce0;
  local_638 = local_175c;
  local_620 = local_ce0;
  local_618 = local_9e8;
  local_610 = local_648;
  local_5e0 = local_a48;
  local_5d8 = local_ce8;
  local_5d0 = local_648;
  local_5b0 = local_648;
  local_5a8 = local_a48;
  local_5a0 = local_ce8;
  local_588 = local_cf8;
  uStack_580 = uStack_cf0;
  local_438 = local_ce8;
  local_430 = local_a48;
  local_428 = local_598;
  uStack_420 = uStack_590;
  local_410 = local_a48;
  local_408 = fStack_16d4;
  fStack_404 = fStack_16d4;
  fStack_400 = fStack_16d4;
  fStack_3fc = fStack_16d4;
  local_3f8 = local_cf8;
  uStack_3f0 = uStack_cf0;
  local_3e0 = local_ce8;
  local_378 = local_bc8;
  local_370 = local_a68;
  local_368 = local_758;
  uStack_360 = uStack_750;
  local_350 = local_a68;
  local_348 = fStack_2644;
  fStack_344 = fStack_2644;
  fStack_340 = fStack_2644;
  fStack_33c = fStack_2644;
  local_338 = local_bd8;
  uStack_330 = uStack_bd0;
  local_320 = local_bc8;
  local_318 = local_b38;
  local_310 = local_a78;
  local_308 = local_838;
  uStack_300 = uStack_830;
  local_2f0 = local_a78;
  local_2e8 = fStack_2664;
  fStack_2e4 = fStack_2664;
  fStack_2e0 = fStack_2664;
  fStack_2dc = fStack_2664;
  local_2d8 = local_b48;
  uStack_2d0 = uStack_b40;
  local_2c0 = local_b38;
  local_1f8 = local_ce8;
  local_1f0 = local_9e8;
  local_1e8 = local_608;
  uStack_1e0 = uStack_600;
  local_1d0 = local_9e8;
  local_1c8 = fStack_16d0;
  fStack_1c4 = fStack_16d0;
  fStack_1c0 = fStack_16d0;
  fStack_1bc = fStack_16d0;
  local_1b8 = local_cf8;
  uStack_1b0 = uStack_cf0;
  local_1a0 = local_ce8;
  local_138 = local_bc8;
  local_130 = local_a08;
  local_128 = local_7c8;
  uStack_120 = uStack_7c0;
  local_110 = local_a08;
  local_108 = fStack_2640;
  fStack_104 = fStack_2640;
  fStack_100 = fStack_2640;
  fStack_fc = fStack_2640;
  local_f8 = local_bd8;
  uStack_f0 = uStack_bd0;
  local_e0 = local_bc8;
  local_d8 = local_b38;
  local_d0 = local_a18;
  local_c8 = local_8a8;
  uStack_c0 = uStack_8a0;
  local_b0 = local_a18;
  local_a8 = fStack_2660;
  fStack_a4 = fStack_2660;
  fStack_a0 = fStack_2660;
  fStack_9c = fStack_2660;
  local_98 = local_b48;
  uStack_90 = uStack_b40;
  local_80 = local_b38;
  local_2b38 = local_2728;
  uStack_2b30 = uStack_2720;
  local_2a08 = local_b48;
  uStack_2a00 = uStack_b40;
  local_29d8 = local_bd8;
  uStack_29d0 = uStack_bd0;
  local_2908 = local_26e8;
  uStack_2900 = uStack_26e0;
  local_28d8 = local_26c8;
  uStack_28d0 = uStack_26c0;
  local_17e8 = local_cf8;
  uStack_17e0 = uStack_cf0;
  local_17c8 = local_16f8;
  uStack_17c0 = uStack_16f0;
  local_d68 = local_5f8;
  uStack_d60 = uStack_5f0;
  local_d58 = local_d08;
  uStack_d50 = uStack_d00;
  local_d48 = local_608;
  uStack_d40 = uStack_600;
  local_d38 = local_598;
  uStack_d30 = uStack_590;
  local_d28 = local_cf8;
  uStack_d20 = uStack_cf0;
  local_c48 = local_7b8;
  uStack_c40 = uStack_7b0;
  local_c38 = local_be8;
  uStack_c30 = uStack_be0;
  local_c28 = local_7c8;
  uStack_c20 = uStack_7c0;
  local_c18 = local_758;
  uStack_c10 = uStack_750;
  local_c08 = local_bd8;
  uStack_c00 = uStack_bd0;
  local_bb8 = local_898;
  uStack_bb0 = uStack_890;
  local_ba8 = local_b58;
  uStack_ba0 = uStack_b50;
  local_b98 = local_8a8;
  uStack_b90 = uStack_8a0;
  local_b88 = local_838;
  uStack_b80 = uStack_830;
  local_b78 = local_b48;
  uStack_b70 = uStack_b40;
  local_1718 = local_2628;
  fStack_1714 = fStack_2624;
  local_1708 = local_2628;
  fStack_1704 = fStack_2624;
  local_16e8 = local_2628;
  fStack_16e4 = fStack_2624;
  fStack_1710 = fStack_2620;
  fStack_170c = fStack_261c;
  fStack_1700 = fStack_2620;
  fStack_16fc = fStack_261c;
  fStack_16e0 = fStack_2620;
  fStack_16dc = fStack_261c;
  local_182c = sinf(local_2b04[0]);
  local_1194 = *local_1810;
  local_1830 = cosf(local_1194);
  local_1834 = local_1828 * local_1828 + (1.0 - local_1828 * local_1828) * local_1830;
  local_1838 = local_1828 * fStack_1824 * (1.0 - local_1830) - fStack_1820 * local_182c;
  local_183c = local_1828 * fStack_1820 * (1.0 - local_1830) + fStack_1824 * local_182c;
  local_1840 = local_1828 * fStack_1824 * (1.0 - local_1830) + fStack_1820 * local_182c;
  local_1844 = fStack_1824 * fStack_1824 + (1.0 - fStack_1824 * fStack_1824) * local_1830;
  local_1848 = fStack_1824 * fStack_1820 * (1.0 - local_1830) - local_1828 * local_182c;
  local_184c = local_1828 * fStack_1820 * (1.0 - local_1830) - fStack_1824 * local_182c;
  local_1050 = &local_1834;
  local_1058 = &local_1838;
  local_1060 = &local_183c;
  local_1068 = &local_1840;
  local_1070 = &local_1844;
  local_1078 = &local_1848;
  local_1080 = &local_184c;
  local_1088 = &local_1850;
  local_1090 = &local_1854;
  local_f9c = 0;
  local_fb8 = CONCAT44(local_1840,local_1834);
  uStack_fb0 = (ulong)(uint)local_184c;
  local_1018 = local_1ec8;
  local_fbc = 0;
  uStack_fd0 = (ulong)(uint)local_1850;
  local_1000 = local_1eb8;
  local_fdc = 0;
  uStack_ff0 = (ulong)(uint)local_1854;
  local_f68 = local_2b78;
  local_f60 = local_2b68;
  local_11f0 = &local_2b58;
  local_ef8 = local_1ec8;
  local_ef0 = local_2b78;
  local_f08 = local_1eb8;
  local_f00 = local_2b68;
  local_11e8 = &local_1218;
  local_ec8 = 0;
  uStack_ec0 = 0;
  local_1218 = 0;
  uStack_1210 = 0;
  local_2b58 = 0;
  uStack_2b50 = 0;
  local_2a90 = &local_2b48;
  local_1d74 = (float)local_2b28;
  local_1d70 = &local_1db8;
  local_1968 = CONCAT44((float)local_2b28,(float)local_2b28);
  uStack_1960 = CONCAT44((float)local_2b28,(float)local_2b28);
  local_1d60 = local_1dd8;
  local_1900 = local_2b78;
  local_1d54._0_4_ = (undefined4)uStack_2b20;
  local_1d88 = &local_1df8;
  local_1d38 = CONCAT88(uStack_2b20,uStack_2b20);
  uStack_1d30 = CONCAT88(uStack_2b20,uStack_2b20);
  local_1d90 = local_2b68;
  local_1d80 = &local_1de8;
  local_1d48 = (float)local_2b68._0_8_;
  fStack_1d44 = SUB84(local_2b68._0_8_,4);
  fStack_1d40 = (float)local_2b68._8_8_;
  fStack_1d3c = SUB84(local_2b68._8_8_,4);
  local_1d28 = uStack_2b20 * local_1d48;
  fStack_1d24 = uStack_2b20 * fStack_1d44;
  fStack_1d20 = uStack_2b20 * fStack_1d40;
  fStack_1d1c = uStack_2b20 * fStack_1d3c;
  local_19c8 = &local_1dc8;
  local_18e0 = &local_1918;
  local_18b8 = (float)local_2b78._0_8_;
  fStack_18b4 = SUB84(local_2b78._0_8_,4);
  fStack_18b0 = (float)local_2b78._8_8_;
  fStack_18ac = SUB84(local_2b78._8_8_,4);
  local_1898 = fVar18 * local_18b8;
  fStack_1894 = fVar18 * fStack_18b4;
  fStack_1890 = fVar18 * fStack_18b0;
  fStack_188c = fVar18 * fStack_18ac;
  local_e88 = CONCAT44(fStack_1894,local_1898);
  uStack_e80 = CONCAT44(fStack_188c,fStack_1890);
  local_e98 = (float)local_1de8;
  fStack_e94 = (float)((ulong)local_1de8 >> 0x20);
  fStack_e90 = (float)uStack_1de0;
  fStack_e8c = (float)((ulong)uStack_1de0 >> 0x20);
  local_1878 = local_1898 + local_e98;
  fStack_1874 = fStack_1894 + fStack_e94;
  fStack_1870 = fStack_1890 + fStack_e90;
  fStack_186c = fStack_188c + fStack_e8c;
  local_19a0 = &local_19d8;
  local_1978 = (float)local_2b88;
  fStack_1974 = (float)((ulong)local_2b88 >> 0x20);
  fStack_1970 = (float)uStack_2b80;
  fStack_196c = (float)(uStack_2b80 >> 0x20);
  local_1958 = (float)local_2b28 * local_1978;
  fStack_1954 = (float)local_2b28 * fStack_1974;
  fStack_1950 = (float)local_2b28 * fStack_1970;
  fStack_194c = (float)local_2b28 * fStack_196c;
  local_e68 = CONCAT44(fStack_1954,local_1958);
  uStack_e60 = CONCAT44(fStack_194c,fStack_1950);
  local_e78 = (float)local_1dc8;
  fStack_e74 = (float)((ulong)local_1dc8 >> 0x20);
  fStack_e70 = (float)uStack_1dc0;
  fStack_e6c = (float)((ulong)uStack_1dc0 >> 0x20);
  local_1938 = local_1958 + local_e78;
  fStack_1934 = fStack_1954 + fStack_e74;
  fStack_1930 = fStack_1950 + fStack_e70;
  fStack_192c = fStack_194c + fStack_e6c;
  local_27b8 = &local_2a38;
  local_2748 = (float)local_2b18;
  fStack_2744 = local_2b18._4_4_;
  fStack_2740 = (float)uStack_2b10;
  fStack_273c = uStack_2b10._4_4_;
  local_2688 = local_1938 * (float)local_2b18;
  fStack_2684 = fStack_1934 * local_2b18._4_4_;
  fStack_2680 = fStack_1930 * (float)uStack_2b10;
  fStack_267c = fStack_192c * uStack_2b10._4_4_;
  local_ab8 = CONCAT44(fStack_2684,local_2688);
  uStack_ab0 = CONCAT44(fStack_267c,fStack_2680);
  local_aa0 = &local_ae8;
  local_a88 = &local_af8;
  local_918 = CONCAT44(fStack_2684,fStack_2684);
  uStack_910 = CONCAT44(fStack_2684,fStack_2684);
  local_a28 = &local_b08;
  local_988 = CONCAT44(fStack_2680,fStack_2680);
  uStack_980 = CONCAT44(fStack_2680,fStack_2680);
  local_9c8 = &local_b28;
  local_948 = local_2688 + fStack_2684;
  fStack_944 = fStack_2684 + fStack_2684;
  fStack_940 = fStack_2680 + fStack_2684;
  fStack_93c = fStack_267c + fStack_2684;
  local_978 = CONCAT44(fStack_944,local_948);
  uStack_970 = CONCAT44(fStack_93c,fStack_940);
  local_a98 = &local_b18;
  local_9b8 = local_948 + fStack_2680;
  fStack_9b4 = fStack_944 + fStack_2680;
  fStack_9b0 = fStack_940 + fStack_2680;
  fStack_9ac = fStack_93c + fStack_2680;
  local_ac8 = CONCAT44(fStack_9b4,local_9b8);
  uStack_ac0 = CONCAT44(fStack_9ac,fStack_9b0);
  local_2a88 = &local_2b28;
  local_2a28 = &local_2b18;
  local_2a20 = &local_2b28;
  local_27c8 = &local_2b18;
  local_27c0 = &local_2b28;
  local_2670 = local_27b8;
  local_1f40 = &local_2b28;
  local_1f38 = &local_2b88;
  local_1f30 = local_2a90;
  local_1da8 = &local_2b28;
  local_1da0 = &local_2b88;
  local_1d98 = local_2a90;
  local_1d54._4_8_ = local_1d88;
  local_1d10 = local_1d80;
  local_1d08._0_4_ = local_1d54._0_4_;
  local_1d08._4_4_ = local_1d54._0_4_;
  auStack_1d00._0_4_ = local_1d54._0_4_;
  auStack_1d00._4_4_ = local_1d54._0_4_;
  local_1cec._0_4_ = (double)local_1d54._0_4_;
  local_1cc8 = local_1d74;
  fStack_1cc4 = local_1d74;
  fStack_1cc0 = local_1d74;
  fStack_1cbc = local_1d74;
  local_1cac = local_1d74;
  local_19c0 = &local_2b88;
  local_19b8 = local_1d70;
  local_19b0 = local_2a90;
  local_19a8 = local_19c8;
  local_1998 = local_2a90;
  local_1990 = &local_2b88;
  local_1988 = local_1d70;
  local_1980 = local_19a0;
  local_1940 = local_19a0;
  local_1920 = local_2a90;
  local_1908 = local_1d80;
  local_18f8 = local_1d60;
  local_18f0 = local_19c8;
  local_18e8 = local_1d80;
  local_18d8 = local_19c8;
  local_18d0 = local_1900;
  local_18c8 = local_1d60;
  local_18c0 = local_18e0;
  local_1880 = local_18e0;
  local_1860 = local_19c8;
  local_1854 = fStack_1820 * fStack_1820 + (1.0 - fStack_1820 * fStack_1820) * local_1830;
  local_1850 = fStack_1824 * fStack_1820 * (1.0 - local_1830) + local_1828 * local_182c;
  local_1200 = &local_1ed8;
  local_11f8 = &local_2b88;
  local_11e0 = local_11f0;
  local_1048 = &local_1ed8;
  local_103c = local_184c;
  local_1038 = local_1840;
  local_1034 = local_1834;
  local_1030 = &local_1ed8;
  local_fa8 = local_1834;
  local_fa4 = local_1840;
  local_fa0 = local_184c;
  local_f78 = &local_2b88;
  local_f70 = &local_2b88;
  local_f18 = &local_1ed8;
  local_f10 = &local_2b88;
  local_ee8 = &local_1ed8;
  local_ee0 = &local_2b88;
  local_ed0 = local_11e8;
  local_ad0 = local_27b8;
  local_a90 = local_aa0;
  local_a30 = local_aa0;
  local_9d0 = local_a28;
  local_9c0 = local_a98;
  local_9a0 = local_a98;
  local_998 = local_a28;
  local_990 = local_9c8;
  local_960 = local_a88;
  local_958 = local_aa0;
  local_950 = local_9c8;
  local_930 = local_9c8;
  local_928 = local_a88;
  local_920 = local_aa0;
  local_908 = local_ab8;
  uStack_900 = uStack_ab0;
  local_2b8 = local_aa0;
  local_2b0 = local_a88;
  local_2a8 = local_918;
  uStack_2a0 = uStack_910;
  local_290 = local_a88;
  local_288 = fStack_2684;
  fStack_284 = fStack_2684;
  fStack_280 = fStack_2684;
  fStack_27c = fStack_2684;
  local_278 = local_ab8;
  uStack_270 = uStack_ab0;
  local_260 = local_aa0;
  local_78 = local_aa0;
  local_70 = local_a28;
  local_68 = local_988;
  uStack_60 = uStack_980;
  local_50 = local_a28;
  local_48 = fStack_2680;
  fStack_44 = fStack_2680;
  fStack_40 = fStack_2680;
  fStack_3c = fStack_2680;
  local_38 = local_ab8;
  uStack_30 = uStack_ab0;
  local_20 = local_aa0;
  local_2b88 = local_fb8;
  uStack_2b80 = uStack_fb0;
  local_2a38 = local_ab8;
  uStack_2a30 = uStack_ab0;
  local_1ed8 = local_fb8;
  uStack_1ed0 = uStack_fb0;
  uStack_1ec0 = uStack_fd0;
  uStack_1eb0 = uStack_ff0;
  local_1df8 = local_1d38;
  uStack_1df0 = uStack_1d30;
  local_1de8 = CONCAT44(fStack_1d24,local_1d28);
  uStack_1de0 = CONCAT44(fStack_1d1c,fStack_1d20);
  local_1dc8 = CONCAT44(fStack_1874,local_1878);
  uStack_1dc0 = CONCAT44(fStack_186c,fStack_1870);
  local_1db8 = local_1968;
  uStack_1db0 = uStack_1960;
  local_19d8 = local_e68;
  uStack_19d0 = uStack_e60;
  local_1918 = local_e88;
  uStack_1910 = uStack_e80;
  local_b28 = local_978;
  uStack_b20 = uStack_970;
  local_b18 = local_ac8;
  uStack_b10 = uStack_ac0;
  local_b08 = local_988;
  uStack_b00 = uStack_980;
  local_af8 = local_918;
  uStack_af0 = uStack_910;
  local_ae8 = local_ab8;
  uStack_ae0 = uStack_ab0;
  local_2b28._0_4_ = local_1938;
  local_2b28._4_4_ = fStack_1934;
  local_2738 = local_1938;
  fStack_2734 = fStack_1934;
  local_2b48 = local_1938;
  fStack_2b44 = fStack_1934;
  uStack_2b20._0_4_ = fStack_1930;
  uStack_2b20._4_4_ = fStack_192c;
  fStack_2730 = fStack_1930;
  fStack_272c = fStack_192c;
  fStack_2b40 = fStack_1930;
  fStack_2b3c = fStack_192c;
  local_2b8c = acosf(local_9b8);
  local_2b94 = local_2b8c - local_2b08;
  local_1e88 = &pi;
  local_2b98 = 0x3b4de32f;
  local_1e90 = &pi;
  local_2b9c = 0x4048dc62;
  local_2ae8 = &local_2b94;
  local_2af0 = &local_2b98;
  local_2af8 = &local_2b9c;
  local_10 = 3.138451;
  local_2c6c = local_10;
  if (local_2b94 < 3.138451) {
    local_2c6c = local_2b94;
  }
  local_18 = 0.003141593;
  local_14 = local_2c6c;
  local_2c70 = local_18;
  if (0.003141593 <= local_2c6c) {
    local_2c70 = local_2c6c;
  }
  local_2b90 = local_2b8c - local_2c70;
  local_2910 = &local_2c08;
  local_2920 = &local_2b18;
  local_2228 = (float)local_2b28;
  fStack_2224 = local_2b28._4_4_;
  fStack_2220 = (float)uStack_2b20;
  fStack_221c = uStack_2b20._4_4_;
  local_2210 = &local_2938;
  local_2938 = (float)local_2b28;
  fStack_2934 = local_2b28._4_4_;
  fStack_2930 = (float)uStack_2b20;
  fStack_292c = uStack_2b20._4_4_;
  auVar17._8_8_ = uStack_2b10;
  auVar17._0_8_ = local_2b18;
  local_2230 = local_2958;
  local_21a0 = &local_2948;
  fStack_2100 = (float)local_2b18;
  auVar23._12_4_ = (float)((ulong)uStack_2b10 >> 0x20);
  auVar23._0_8_ = auVar17._4_8_;
  auVar23._8_4_ = fStack_2100;
  local_2098._8_8_ = auVar23._8_8_;
  uStack_2190 = local_2098._8_8_;
  uStack_2940 = local_2098._8_8_;
  local_2268 = CONCAT44(local_2b28._4_4_,(float)local_2b28);
  uStack_2260 = CONCAT44(uStack_2b20._4_4_,(float)uStack_2b20);
  auVar16._4_4_ = local_2b28._4_4_;
  auVar16._0_4_ = (float)local_2b28;
  auVar16._8_4_ = (float)uStack_2b20;
  local_2250 = &local_2978;
  local_21d0 = &local_2968;
  local_2088._0_8_ = auVar16._4_8_;
  local_2088._8_4_ = (float)local_2b28;
  local_2088._12_4_ = uStack_2b20._4_4_;
  uStack_21c0 = local_2088._8_8_;
  uStack_2960 = local_2088._8_8_;
  local_2270 = local_2988;
  local_2160 = &local_29b8;
  uStack_20c0 = local_2088._8_8_;
  fStack_20d4 = (float)((ulong)local_2b18 >> 0x20);
  fStack_20d0 = (float)uStack_2b10;
  local_20b8 = local_2b28._4_4_ * fStack_2100;
  fStack_20b4 = (float)uStack_2b20 * fStack_20d4;
  fStack_20b0 = (float)local_2b28 * fStack_20d0;
  fStack_20ac = uStack_2b20._4_4_ * auVar23._12_4_;
  local_2208 = &local_29a8;
  local_2130 = &local_2178;
  local_2118 = (float)local_2b28;
  fStack_2114 = local_2b28._4_4_;
  fStack_2110 = (float)uStack_2b20;
  fStack_210c = uStack_2b20._4_4_;
  uStack_2120 = local_2098._8_8_;
  local_2108 = (float)local_2b28 * fStack_20d4;
  fStack_2104 = local_2b28._4_4_ * fStack_20d0;
  fStack_2100 = (float)uStack_2b20 * fStack_2100;
  fStack_20fc = uStack_2b20._4_4_ * auVar23._12_4_;
  local_1fa8 = CONCAT44(fStack_2104,local_2108);
  uStack_1fa0 = CONCAT44(fStack_20fc,fStack_2100);
  local_1fb8 = (float)local_29b8;
  fStack_1fb4 = (float)((ulong)local_29b8 >> 0x20);
  fStack_1fb0 = (float)uStack_29b0;
  fStack_1fac = (float)((ulong)uStack_29b0 >> 0x20);
  local_1fe8 = local_2108 - local_1fb8;
  fStack_1fe4 = fStack_2104 - fStack_1fb4;
  fStack_1fe0 = fStack_2100 - fStack_1fb0;
  auVar24._12_4_ = fStack_20fc - fStack_1fac;
  local_2048 = CONCAT44(fStack_1fe4,local_1fe8);
  uStack_2040 = CONCAT44(auVar24._12_4_,fStack_1fe0);
  local_2200 = &local_2998;
  auVar15._8_8_ = uStack_2040;
  auVar15._0_8_ = local_2048;
  auVar24._0_8_ = auVar15._4_8_;
  auVar24._8_4_ = local_1fe8;
  local_2078._8_8_ = auVar24._8_8_;
  uStack_21f0 = local_2078._8_8_;
  uStack_2990 = local_2078._8_8_;
  uStack_25e0 = local_2078._8_8_;
  uStack_2c00 = local_2078._8_8_;
  local_1ef0 = &local_2b90;
  local_14d0 = &local_1508;
  local_1410 = &local_14c8;
  uStack_13e0 = local_2078._8_8_;
  uStack_13f0 = local_2078._8_8_;
  local_13b8 = fStack_1fe4 * fStack_1fe4;
  fStack_13b4 = fStack_1fe0 * fStack_1fe0;
  fStack_13b0 = local_1fe8 * local_1fe8;
  fStack_13ac = auVar24._12_4_ * auVar24._12_4_;
  local_d88 = CONCAT44(fStack_13b4,local_13b8);
  uStack_d80 = CONCAT44(fStack_13ac,fStack_13b0);
  local_d78 = &local_db8;
  local_a38 = &local_dc8;
  local_4b8 = CONCAT44(fStack_13b4,fStack_13b4);
  uStack_4b0 = CONCAT44(fStack_13b4,fStack_13b4);
  local_9d8 = &local_dd8;
  local_528 = CONCAT44(fStack_13b0,fStack_13b0);
  uStack_520 = CONCAT44(fStack_13b0,fStack_13b0);
  local_568 = &local_df8;
  local_4e8 = local_13b8 + fStack_13b4;
  fStack_4e4 = fStack_13b4 + fStack_13b4;
  fStack_4e0 = fStack_13b0 + fStack_13b4;
  fStack_4dc = fStack_13ac + fStack_13b4;
  local_518 = CONCAT44(fStack_4e4,local_4e8);
  uStack_510 = CONCAT44(fStack_4dc,fStack_4e0);
  local_d70 = &local_de8;
  local_143c = local_4e8 + fStack_13b0;
  fStack_554 = fStack_4e4 + fStack_13b0;
  fStack_550 = fStack_4e0 + fStack_13b0;
  fStack_54c = fStack_4dc + fStack_13b0;
  local_d98 = CONCAT44(fStack_554,local_143c);
  uStack_d90 = CONCAT44(fStack_54c,fStack_550);
  local_1318 = ZEXT416((uint)local_143c);
  local_1458 = CONCAT44(0,local_143c);
  uStack_1450 = 0;
  uStack_12f0 = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_1458;
  local_1468 = rsqrtss(auVar14,auVar14);
  local_131c = 0x3fc00000;
  local_1338 = ZEXT416(0x3fc00000);
  local_1248 = local_1468._0_8_;
  uVar1 = local_1248;
  uStack_1240 = local_1468._8_8_;
  local_1248._0_4_ = local_1468._0_4_;
  local_1238 = (ulong)(uint)((float)local_1248 * 1.5);
  uStack_1230 = 0;
  local_133c = 0xbf000000;
  local_1358 = ZEXT416(0xbf000000);
  local_1268 = local_1358._0_8_;
  uStack_1260 = 0;
  local_1258 = (ulong)(uint)(local_143c * -0.5);
  uStack_1250 = 0;
  local_1288 = local_1468._0_8_;
  uStack_1280 = local_1468._8_8_;
  local_148c = local_143c * -0.5 * (float)local_1248;
  local_1278 = (ulong)(uint)local_148c;
  uStack_1270 = 0;
  local_12a8 = local_1468._0_8_;
  uStack_12a0 = local_1468._8_8_;
  local_1298 = CONCAT44(local_1468._4_4_,(float)local_1248 * (float)local_1248);
  uStack_1290 = local_1468._8_8_;
  local_12c8 = local_1298;
  uStack_12c0 = local_1468._8_8_;
  local_148c = local_148c * (float)local_1248 * (float)local_1248;
  local_12b8 = (ulong)(uint)local_148c;
  uStack_12b0 = 0;
  local_12e8 = local_12b8;
  uStack_12e0 = 0;
  local_148c = (float)local_1248 * 1.5 + local_148c;
  local_12d8 = (ulong)(uint)local_148c;
  uStack_12d0 = 0;
  local_1478 = local_12d8;
  uStack_1470 = 0;
  local_1228 = local_12d8;
  uStack_1220 = 0;
  local_1438 = &local_14a8;
  local_13d8 = CONCAT44(local_148c,local_148c);
  uStack_13d0 = CONCAT44(local_148c,local_148c);
  uStack_13c0 = local_2078._8_8_;
  local_1508 = fStack_1fe4 * local_148c;
  fStack_1504 = fStack_1fe0 * local_148c;
  fStack_1500 = local_1fe8 * local_148c;
  fStack_138c = auVar24._12_4_ * local_148c;
  local_2918 = &local_2b28;
  local_25e8 = auVar24._0_8_;
  local_25d0 = local_2910;
  local_21f8 = auVar24._0_8_;
  local_21e0 = local_2200;
  local_21d8 = local_2250;
  local_21c8 = local_2088._0_8_;
  local_21b0 = local_21d0;
  local_21a8 = local_2230;
  local_2198 = auVar23._0_8_;
  local_2180 = local_21a0;
  local_2158 = local_21a0;
  local_2150 = local_2210;
  local_2148 = local_2208;
  local_2140 = local_21a0;
  local_2138 = local_2210;
  local_2128 = auVar23._0_8_;
  local_20f8 = local_2130;
  local_20f0 = local_2270;
  local_20e8 = local_21d0;
  local_20e0 = local_2160;
  local_20c8 = local_2088._0_8_;
  local_20a8 = local_2160;
  local_20a0 = local_2200;
  local_2098 = auVar23;
  local_2078 = auVar24;
  local_2058 = local_2268;
  uStack_2050 = uStack_2260;
  local_2038 = local_2270;
  local_2030 = local_21d0;
  local_2028 = local_21a0;
  local_2020 = local_2210;
  local_2018 = local_2230;
  local_2010 = local_2250;
  local_2008 = local_2208;
  local_2000 = local_2160;
  local_1ff8 = local_2130;
  local_1ff0 = local_2208;
  fStack_1fdc = auVar24._12_4_;
  local_1fd0 = local_2208;
  local_1fc8 = local_2160;
  local_1fc0 = local_2130;
  local_1ee8 = local_2910;
  local_1ee0 = &local_2bf8;
  local_14f0 = local_1ef0;
  local_14e8 = local_2910;
  local_14e0 = &local_1f28;
  local_14d8 = local_2910;
  local_14b8 = local_2910;
  local_14b0 = local_2910;
  local_1488 = local_2910;
  local_1480 = local_14d0;
  local_1430 = local_2910;
  local_1428 = local_14d0;
  local_1420 = local_2910;
  local_1418 = local_2910;
  local_1404 = local_148c;
  local_1400 = local_1438;
  local_13f8 = auVar24._0_8_;
  local_13e8 = auVar24._0_8_;
  local_13c8 = auVar24._0_8_;
  local_13a0 = local_1410;
  local_1398 = local_1508;
  fStack_1394 = fStack_1504;
  fStack_1390 = fStack_1500;
  local_1380 = local_14d0;
  local_1378 = local_148c;
  fStack_1374 = local_148c;
  fStack_1370 = local_148c;
  fStack_136c = local_148c;
  local_135c = local_148c;
  local_12fc = local_143c;
  local_12f8 = local_1458;
  local_1248 = uVar1;
  local_da0 = local_1410;
  local_a40 = local_d78;
  local_9e0 = local_d78;
  local_570 = local_9d8;
  local_560 = local_d70;
  local_558 = local_143c;
  local_540 = local_d70;
  local_538 = local_9d8;
  local_530 = local_568;
  local_500 = local_a38;
  local_4f8 = local_d78;
  local_4f0 = local_568;
  local_4d0 = local_568;
  local_4c8 = local_a38;
  local_4c0 = local_d78;
  local_4a8 = local_d88;
  uStack_4a0 = uStack_d80;
  local_498 = local_d78;
  local_490 = local_a38;
  local_488 = local_4b8;
  uStack_480 = uStack_4b0;
  local_470 = local_a38;
  local_468 = fStack_13b4;
  fStack_464 = fStack_13b4;
  fStack_460 = fStack_13b4;
  fStack_45c = fStack_13b4;
  local_458 = local_d88;
  uStack_450 = uStack_d80;
  local_440 = local_d78;
  local_258 = local_d78;
  local_250 = local_9d8;
  local_248 = local_528;
  uStack_240 = uStack_520;
  local_230 = local_9d8;
  local_228 = fStack_13b0;
  fStack_224 = fStack_13b0;
  fStack_220 = fStack_13b0;
  fStack_21c = fStack_13b0;
  local_218 = local_d88;
  uStack_210 = uStack_d80;
  local_200 = local_d78;
  local_c = local_2b94;
  local_2c08 = auVar24._0_8_;
  local_29b8 = CONCAT44(fStack_20b4,local_20b8);
  uStack_29b0 = CONCAT44(fStack_20ac,fStack_20b0);
  local_29a8 = local_2048;
  uStack_29a0 = uStack_2040;
  local_2998 = auVar24._0_8_;
  local_2978 = local_2268;
  uStack_2970 = uStack_2260;
  local_2968 = local_2088._0_8_;
  local_2948 = auVar23._0_8_;
  local_2178 = local_1fa8;
  uStack_2170 = uStack_1fa0;
  local_14c8 = local_d88;
  uStack_14c0 = uStack_d80;
  local_14a8 = local_13d8;
  uStack_14a0 = uStack_13d0;
  local_df8 = local_518;
  uStack_df0 = uStack_510;
  local_de8 = local_d98;
  uStack_de0 = uStack_d90;
  local_dd8 = local_528;
  uStack_dd0 = uStack_520;
  local_dc8 = local_4b8;
  uStack_dc0 = uStack_4b0;
  local_db8 = local_d88;
  uStack_db0 = uStack_d80;
  local_150c = sinf(fVar22);
  local_1198 = *local_14f0;
  local_1510 = cosf(local_1198);
  local_1514 = local_1508 * local_1508 + (1.0 - local_1508 * local_1508) * local_1510;
  local_1518 = local_1508 * fStack_1504 * (1.0 - local_1510) - fStack_1500 * local_150c;
  local_151c = local_1508 * fStack_1500 * (1.0 - local_1510) + fStack_1504 * local_150c;
  local_1520 = local_1508 * fStack_1504 * (1.0 - local_1510) + fStack_1500 * local_150c;
  local_1524 = fStack_1504 * fStack_1504 + (1.0 - fStack_1504 * fStack_1504) * local_1510;
  local_1528 = fStack_1504 * fStack_1500 * (1.0 - local_1510) - local_1508 * local_150c;
  local_152c = local_1508 * fStack_1500 * (1.0 - local_1510) - fStack_1504 * local_150c;
  local_1150 = &local_1514;
  local_1158 = &local_1518;
  local_1160 = &local_151c;
  local_1168 = &local_1520;
  local_1170 = &local_1524;
  local_1178 = &local_1528;
  local_1180 = &local_152c;
  local_1188 = &local_1530;
  local_1190 = &local_1534;
  local_1094 = 0;
  local_10b8 = CONCAT44(local_1520,local_1514);
  uStack_10b0 = (ulong)(uint)local_152c;
  local_1118 = local_1f18;
  local_10bc = 0;
  uStack_10d0 = (ulong)(uint)local_1530;
  local_1100 = local_1f08;
  local_10dc = 0;
  uStack_10f0 = (ulong)(uint)local_1534;
  local_f88 = local_2be8;
  local_f80 = local_2bd8;
  local_11b8 = &local_2bc8;
  local_f38 = local_1f18;
  local_f30 = local_2be8;
  local_f48 = local_1f08;
  local_f40 = local_2bd8;
  local_11b0 = &local_11d8;
  local_eb8 = 0;
  uStack_eb0 = 0;
  local_11d8 = 0;
  uStack_11d0 = 0;
  local_2bc8 = 0;
  uStack_2bc0 = 0;
  local_2aa0 = &local_2bb8;
  local_1c24 = (float)local_2b28;
  local_1c20 = &local_1c68;
  local_1ae8 = CONCAT44((float)local_2b28,(float)local_2b28);
  uStack_1ae0 = CONCAT44((float)local_2b28,(float)local_2b28);
  local_1c14 = local_2b28._4_4_;
  local_1c10 = &local_1c88;
  local_1a28 = CONCAT44(local_2b28._4_4_,local_2b28._4_4_);
  uStack_1a20 = CONCAT44(local_2b28._4_4_,local_2b28._4_4_);
  local_1a80 = local_2be8;
  local_1c04 = (float)uStack_2b20;
  local_1c38 = &local_1ca8;
  local_1be8 = CONCAT44((float)uStack_2b20,(float)uStack_2b20);
  uStack_1be0 = CONCAT44((float)uStack_2b20,(float)uStack_2b20);
  local_1c40 = local_2bd8;
  local_1c30 = &local_1c98;
  local_1bf8 = (float)local_2bd8._0_8_;
  fStack_1bf4 = SUB84(local_2bd8._0_8_,4);
  fStack_1bf0 = (float)local_2bd8._8_8_;
  fStack_1bec = SUB84(local_2bd8._8_8_,4);
  local_1bd8 = (float)uStack_2b20 * local_1bf8;
  fStack_1bd4 = (float)uStack_2b20 * fStack_1bf4;
  fStack_1bd0 = (float)uStack_2b20 * fStack_1bf0;
  fStack_1bcc = (float)uStack_2b20 * fStack_1bec;
  local_1b48 = &local_1c78;
  local_1a60 = &local_1a98;
  local_1a38 = (float)local_2be8._0_8_;
  fStack_1a34 = SUB84(local_2be8._0_8_,4);
  fStack_1a30 = (float)local_2be8._8_8_;
  fStack_1a2c = SUB84(local_2be8._8_8_,4);
  local_1a18 = local_2b28._4_4_ * local_1a38;
  fStack_1a14 = local_2b28._4_4_ * fStack_1a34;
  fStack_1a10 = local_2b28._4_4_ * fStack_1a30;
  fStack_1a0c = local_2b28._4_4_ * fStack_1a2c;
  local_e48 = CONCAT44(fStack_1a14,local_1a18);
  uStack_e40 = CONCAT44(fStack_1a0c,fStack_1a10);
  local_e58 = (float)local_1c98;
  fStack_e54 = (float)((ulong)local_1c98 >> 0x20);
  fStack_e50 = (float)uStack_1c90;
  fStack_e4c = (float)((ulong)uStack_1c90 >> 0x20);
  local_19f8 = local_1a18 + local_e58;
  fStack_19f4 = fStack_1a14 + fStack_e54;
  fStack_19f0 = fStack_1a10 + fStack_e50;
  fStack_19ec = fStack_1a0c + fStack_e4c;
  local_1b20 = &local_1b58;
  local_1af8 = (float)local_2bf8;
  fStack_1af4 = (float)((ulong)local_2bf8 >> 0x20);
  fStack_1af0 = (float)uStack_2bf0;
  fStack_1aec = (float)(uStack_2bf0 >> 0x20);
  local_1ad8 = (float)local_2b28 * local_1af8;
  fStack_1ad4 = (float)local_2b28 * fStack_1af4;
  fStack_1ad0 = (float)local_2b28 * fStack_1af0;
  fStack_1acc = (float)local_2b28 * fStack_1aec;
  local_e28 = CONCAT44(fStack_1ad4,local_1ad8);
  uStack_e20 = CONCAT44(fStack_1acc,fStack_1ad0);
  local_e38 = (float)local_1c78;
  fStack_e34 = (float)((ulong)local_1c78 >> 0x20);
  fStack_e30 = (float)uStack_1c70;
  fStack_e2c = (float)((ulong)uStack_1c70 >> 0x20);
  local_1ab8 = local_1ad8 + local_e38;
  fStack_1ab4 = fStack_1ad4 + fStack_e34;
  fStack_1ab0 = fStack_1ad0 + fStack_e30;
  fStack_1aac = fStack_1acc + fStack_e2c;
  local_2ad8 = in_RDI + 2;
  local_2ad0 = &local_2c38;
  uVar1 = *local_2ad8;
  uVar2 = in_RDI[3];
  uVar3 = *in_RDI;
  uVar4 = in_RDI[1];
  local_1f68._0_4_ = (float)uVar1;
  local_1f68._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_1f60._0_4_ = (float)uVar2;
  uStack_1f60._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_1f78._0_4_ = (float)uVar3;
  local_1f78._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_1f70._0_4_ = (float)uVar4;
  uStack_1f70._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_2588 = (float)local_1f68 - (float)local_1f78;
  fStack_2584 = local_1f68._4_4_ - local_1f78._4_4_;
  fStack_2580 = (float)uStack_1f60 - (float)uStack_1f70;
  fStack_257c = uStack_1f60._4_4_ - uStack_1f70._4_4_;
  local_1e38 = CONCAT44(fStack_2584,local_2588);
  uStack_1e30 = CONCAT44(fStack_257c,fStack_2580);
  local_1e40 = &local_1e78;
  local_1e18 = local_2588 * local_2588;
  fStack_1e14 = fStack_2584 * fStack_2584;
  fStack_1e10 = fStack_2580 * fStack_2580;
  fStack_1e0c = fStack_257c * fStack_257c;
  local_c68 = CONCAT44(fStack_1e14,local_1e18);
  uStack_c60 = CONCAT44(fStack_1e0c,fStack_1e10);
  local_c58 = &local_c98;
  local_a58 = &local_ca8;
  local_678 = CONCAT44(fStack_1e14,fStack_1e14);
  uStack_670 = CONCAT44(fStack_1e14,fStack_1e14);
  local_9f8 = &local_cb8;
  local_6e8 = CONCAT44(fStack_1e10,fStack_1e10);
  uStack_6e0 = CONCAT44(fStack_1e10,fStack_1e10);
  local_728 = &local_cd8;
  local_6a8 = local_1e18 + fStack_1e14;
  fStack_6a4 = fStack_1e14 + fStack_1e14;
  fStack_6a0 = fStack_1e10 + fStack_1e14;
  fStack_69c = fStack_1e0c + fStack_1e14;
  local_6d8 = CONCAT44(fStack_6a4,local_6a8);
  uStack_6d0 = CONCAT44(fStack_69c,fStack_6a0);
  local_c50 = &local_cc8;
  local_e9c = local_6a8 + fStack_1e10;
  fStack_714 = fStack_6a4 + fStack_1e10;
  fStack_710 = fStack_6a0 + fStack_1e10;
  fStack_70c = fStack_69c + fStack_1e10;
  local_c78 = CONCAT44(fStack_714,local_e9c);
  uStack_c70 = CONCAT44(fStack_70c,fStack_710);
  local_2a98 = &local_2b28;
  local_2570 = local_2ad0;
  local_1f78 = uVar3;
  uStack_1f70 = uVar4;
  local_1f68 = uVar1;
  uStack_1f60 = uVar2;
  local_1f58 = &local_2b28;
  local_1f50 = &local_2bf8;
  local_1f48 = local_2aa0;
  local_1e80 = local_2ad0;
  local_1e60 = local_2ad0;
  local_1e58 = local_2ad0;
  local_1e50 = local_2ad0;
  local_1e48 = local_2ad0;
  local_1e28 = local_1e38;
  uStack_1e20 = uStack_1e30;
  local_1e00 = local_1e40;
  local_1c58 = &local_2b28;
  local_1c50 = &local_2bf8;
  local_1c48 = local_2aa0;
  local_1c00 = local_1c38;
  local_1bc0 = local_1c30;
  local_1bb8 = local_1c04;
  fStack_1bb4 = local_1c04;
  fStack_1bb0 = local_1c04;
  fStack_1bac = local_1c04;
  local_1b9c = local_1c04;
  local_1b98 = local_1c14;
  fStack_1b94 = local_1c14;
  fStack_1b90 = local_1c14;
  fStack_1b8c = local_1c14;
  local_1b7c = local_1c14;
  local_1b78 = local_1c24;
  fStack_1b74 = local_1c24;
  fStack_1b70 = local_1c24;
  fStack_1b6c = local_1c24;
  local_1b5c = local_1c24;
  local_1b40 = &local_2bf8;
  local_1b38 = local_1c20;
  local_1b30 = local_2aa0;
  local_1b28 = local_1b48;
  local_1b18 = local_2aa0;
  local_1b10 = &local_2bf8;
  local_1b08 = local_1c20;
  local_1b00 = local_1b20;
  local_1ac0 = local_1b20;
  local_1aa0 = local_2aa0;
  local_1a88 = local_1c30;
  local_1a78 = local_1c10;
  local_1a70 = local_1b48;
  local_1a68 = local_1c30;
  local_1a58 = local_1b48;
  local_1a50 = local_1a80;
  local_1a48 = local_1c10;
  local_1a40 = local_1a60;
  local_1a00 = local_1a60;
  local_19e0 = local_1b48;
  local_1534 = fStack_1500 * fStack_1500 + (1.0 - fStack_1500 * fStack_1500) * local_1510;
  local_1530 = fStack_1504 * fStack_1500 * (1.0 - local_1510) + local_1508 * local_150c;
  local_11c8 = &local_1f28;
  local_11c0 = &local_2bf8;
  local_11a8 = local_11b8;
  local_1148 = &local_1f28;
  local_113c = local_152c;
  local_1138 = local_1520;
  local_1134 = local_1514;
  local_1130 = &local_1f28;
  local_10a0 = local_1514;
  local_109c = local_1520;
  local_1098 = local_152c;
  local_f98 = &local_2bf8;
  local_f90 = &local_2bf8;
  local_f58 = &local_1f28;
  local_f50 = &local_2bf8;
  local_f28 = &local_1f28;
  local_f20 = &local_2bf8;
  local_ed8 = local_11b0;
  local_c80 = local_1e40;
  local_a60 = local_c58;
  local_a00 = local_c58;
  local_730 = local_9f8;
  local_720 = local_c50;
  local_718 = local_e9c;
  local_700 = local_c50;
  local_6f8 = local_9f8;
  local_6f0 = local_728;
  local_6c0 = local_a58;
  local_6b8 = local_c58;
  local_6b0 = local_728;
  local_690 = local_728;
  local_688 = local_a58;
  local_680 = local_c58;
  local_668 = local_c68;
  uStack_660 = uStack_c60;
  local_3d8 = local_c58;
  local_3d0 = local_a58;
  local_3c8 = local_678;
  uStack_3c0 = uStack_670;
  local_3b0 = local_a58;
  local_3a8 = fStack_1e14;
  fStack_3a4 = fStack_1e14;
  fStack_3a0 = fStack_1e14;
  fStack_39c = fStack_1e14;
  local_398 = local_c68;
  uStack_390 = uStack_c60;
  local_380 = local_c58;
  local_198 = local_c58;
  local_190 = local_9f8;
  local_188 = local_6e8;
  uStack_180 = uStack_6e0;
  local_170 = local_9f8;
  local_168 = fStack_1e10;
  fStack_164 = fStack_1e10;
  fStack_160 = fStack_1e10;
  fStack_15c = fStack_1e10;
  local_158 = local_c68;
  uStack_150 = uStack_c60;
  local_140 = local_c58;
  local_2c38 = local_1e38;
  uStack_2c30 = uStack_1e30;
  local_2bf8 = local_10b8;
  uStack_2bf0 = uStack_10b0;
  local_1f28 = local_10b8;
  uStack_1f20 = uStack_10b0;
  uStack_1f10 = uStack_10d0;
  uStack_1f00 = uStack_10f0;
  local_1e78 = local_c68;
  uStack_1e70 = uStack_c60;
  local_1ca8 = local_1be8;
  uStack_1ca0 = uStack_1be0;
  local_1c98 = CONCAT44(fStack_1bd4,local_1bd8);
  uStack_1c90 = CONCAT44(fStack_1bcc,fStack_1bd0);
  local_1c88 = local_1a28;
  uStack_1c80 = uStack_1a20;
  local_1c78 = CONCAT44(fStack_19f4,local_19f8);
  uStack_1c70 = CONCAT44(fStack_19ec,fStack_19f0);
  local_1c68 = local_1ae8;
  uStack_1c60 = uStack_1ae0;
  local_1b58 = local_e28;
  uStack_1b50 = uStack_e20;
  local_1a98 = local_e48;
  uStack_1a90 = uStack_e40;
  local_cd8 = local_6d8;
  uStack_cd0 = uStack_6d0;
  local_cc8 = local_c78;
  uStack_cc0 = uStack_c70;
  local_cb8 = local_6e8;
  uStack_cb0 = uStack_6e0;
  local_ca8 = local_678;
  uStack_ca0 = uStack_670;
  local_c98 = local_c68;
  uStack_c90 = uStack_c60;
  local_2b28._0_4_ = local_1ab8;
  local_2b28._4_4_ = fStack_1ab4;
  local_2bb8 = local_1ab8;
  fStack_2bb4 = fStack_1ab4;
  uStack_2b20._0_4_ = fStack_1ab0;
  uStack_2b20._4_4_ = fStack_1aac;
  fStack_2bb0 = fStack_1ab0;
  fStack_2bac = fStack_1aac;
  fVar22 = sqrtf(local_e9c);
  local_e08 = (float)*in_RDI;
  fStack_e04 = (float)((ulong)*in_RDI >> 0x20);
  fStack_e00 = (float)in_RDI[1];
  fStack_dfc = (float)((ulong)in_RDI[1] >> 0x20);
  in_RDI[2] = CONCAT44(fStack_e04 + fVar22 * local_2b28._4_4_,local_e08 + fVar22 * (float)local_2b28
                      );
  in_RDI[3] = CONCAT44(fStack_dfc + fVar22 * uStack_2b20._4_4_,
                       fStack_e00 + fVar22 * (float)uStack_2b20);
  return;
}

Assistant:

void rotate (float dtheta, float dphi)
    {
      if (handedness == RIGHT_HANDED) dtheta *= -1.0f;
      const Vec3fa up1 = normalize(up);
      Vec3fa view1 = normalize(to-from);
      view1 = xfmVector(AffineSpace3fa::rotate(up1, dtheta), view1);
      const float phi = acosf(dot(view1, up1));
      const float dphi2 = phi - clamp(phi-dphi, 0.001f*float(pi), 0.999f*float(pi));
      view1 = xfmVector(AffineSpace3fa::rotate(cross(view1, up1), dphi2), view1);
      to = from + length(to-from) * view1;
    }